

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O2

Statement *
slang::ast::ForeachLoopStatement::fromSyntax
          (Compilation *compilation,ForeachLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar1;
  ForeachLoopListSyntax *pFVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  NameSyntax *pNVar6;
  StatementSyntax *this;
  ulong uVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ForeachLoopStatement *stmt;
  ForeachLoopStatement *pFVar8;
  ParentList *pPVar9;
  EVP_PKEY_CTX *src;
  ForeachLoopStatement *ctx;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>,_(std::ranges::subrange_kind)0>
  sVar10;
  specific_symbol_iterator<slang::ast::IteratorSymbol> itIt;
  iterator __begin2;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  guard;
  SmallVector<slang::ast::ForeachLoopStatement::LoopDim,_4UL> dims;
  specific_symbol_iterator<slang::ast::IteratorSymbol> local_108;
  iterator_base<slang::syntax::NameSyntax_*> local_100;
  _Storage<slang::ConstantRange,_true> local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  undefined8 local_e0;
  ForeachLoopStatement *local_d8;
  ASTContext *local_d0;
  StatementContext *local_c8;
  ScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_source____include_slang_ast_Statement_h:162:37)>
  local_c0;
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> local_a8 [2];
  
  local_c0.func.savedFlags.m_bits = (stmtCtx->flags).m_bits;
  local_c0.valid = true;
  (stmtCtx->flags).m_bits = local_c0.func.savedFlags.m_bits | 1;
  local_c8 = stmtCtx;
  local_c0.func.this = stmtCtx;
  iVar5 = Expression::bind((int)(((syntax->loopList).ptr)->arrayName).ptr,(sockaddr *)context,0);
  local_d8 = (ForeachLoopStatement *)CONCAT44(extraout_var,iVar5);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  this = (local_d8->super_Statement).syntax;
  local_d0 = context;
  sVar10 = Scope::membersOfType<slang::ast::IteratorSymbol>((context->scope).ptr);
  local_108 = sVar10._M_begin.current;
  pFVar2 = (syntax->loopList).ptr;
  pSVar1 = &pFVar2->loopVariables;
  local_100.index = 0;
  local_100.list = pSVar1;
  sVar3 = (pFVar2->loopVariables).elements._M_extent._M_extent_value;
  uVar7 = 0;
  pPVar9 = pSVar1;
  while ((pPVar9 != pSVar1 || (uVar7 != sVar3 + 1 >> 1))) {
    pNVar6 = slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>::
             iterator_base<slang::syntax::NameSyntax_*>::dereference(&local_100);
    bVar4 = Type::hasFixedRange((Type *)this);
    if (bVar4) {
      local_f0._M_value = Type::getFixedRange((Type *)this);
      _local_e8 = CONCAT71(uStack_e7,1);
      local_e0 = 0;
      SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
      emplace_back<slang::ast::ForeachLoopStatement::LoopDim>
                (local_a8,(LoopDim *)&local_f0._M_value);
    }
    else {
      SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplace_back<>(local_a8);
    }
    this = (StatementSyntax *)Type::getArrayElementType((Type *)this);
    if ((pNVar6->super_ExpressionSyntax).super_SyntaxNode.kind != EmptyIdentifierName) {
      local_a8[0].data_[local_a8[0].len - 1].loopVar = (IteratorSymbol *)local_108.current;
      Scope::specific_symbol_iterator<slang::ast::IteratorSymbol>::increment(&local_108);
    }
    uVar7 = local_100.index + 1;
    local_100.index = uVar7;
    pPVar9 = local_100.list;
  }
  iVar5 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)local_d0,(socklen_t)local_c8);
  local_f0._0_4_ =
       SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::copy
                 (local_a8,(EVP_PKEY_CTX *)compilation,src);
  local_f0._M_value.right = extraout_var_01;
  local_100 = (iterator_base<slang::syntax::NameSyntax_*>)
              slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  ctx = local_d8;
  stmt = BumpAllocator::
         emplace<slang::ast::ForeachLoopStatement,slang::ast::Expression_const&,std::span<slang::ast::ForeachLoopStatement::LoopDim,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                   (&compilation->super_BumpAllocator,(Expression *)local_d8,
                    (span<slang::ast::ForeachLoopStatement::LoopDim,_18446744073709551615UL> *)
                    &local_f0._M_value,(Statement *)CONCAT44(extraout_var_00,iVar5),
                    (SourceRange *)&local_100);
  pFVar8 = stmt;
  if (((Statement *)CONCAT44(extraout_var_00,iVar5))->kind == Invalid) {
    pFVar8 = (ForeachLoopStatement *)Statement::badStmt(compilation,&stmt->super_Statement);
    ctx = stmt;
  }
  SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::cleanup(local_a8,(EVP_PKEY_CTX *)ctx);
  ScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/Statement.h:162:37)>
  ::~ScopeGuard(&local_c0);
  return &pFVar8->super_Statement;
}

Assistant:

Statement& ForeachLoopStatement::fromSyntax(Compilation& compilation,
                                            const ForeachLoopStatementSyntax& syntax,
                                            const ASTContext& context, StatementContext& stmtCtx) {
    auto guard = stmtCtx.enterLoop();

    auto& arrayRef = Expression::bind(*syntax.loopList->arrayName, context);
    SLANG_ASSERT(!arrayRef.bad());

    // Loop variables were already built in the containing block when it was elaborated,
    // so we just have to find them and associate them with the correct dim ranges here.
    SmallVector<LoopDim, 4> dims;
    const Type* type = arrayRef.type;
    auto range = context.scope->membersOfType<IteratorSymbol>();
    auto itIt = range.begin();

    for (auto loopVar : syntax.loopList->loopVariables) {
        if (type->hasFixedRange())
            dims.push_back({type->getFixedRange()});
        else
            dims.emplace_back();

        type = type->getArrayElementType();

        if (loopVar->kind == SyntaxKind::EmptyIdentifierName)
            continue;

        SLANG_ASSERT(itIt != range.end());
        SLANG_ASSERT(itIt->name == loopVar->as<IdentifierNameSyntax>().identifier.valueText());

        IteratorSymbol* it = const_cast<IteratorSymbol*>(&*itIt);
        dims.back().loopVar = it;
        itIt++;
    }

    SLANG_ASSERT(itIt == range.end());

    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);
    auto result = compilation.emplace<ForeachLoopStatement>(arrayRef, dims.copy(compilation),
                                                            bodyStmt, syntax.sourceRange());
    if (bodyStmt.bad())
        return badStmt(compilation, result);
    return *result;
}